

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *
bijectiveParameterization(Mesh *mesh,double error)

{
  float fVar1;
  size_type sVar2;
  float *pfVar3;
  Scalar *pSVar4;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *in_RDI;
  int i_1;
  double epsilon;
  int i;
  VectorXd x;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> init_param;
  double *in_stack_000007b8;
  VectorXd *in_stack_000007c0;
  Mesh *in_stack_000007c8;
  undefined4 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffedc;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffee0;
  unsigned_long *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  int local_8c;
  VectorXd *in_stack_ffffffffffffff78;
  Mesh *in_stack_ffffffffffffff80;
  int local_58;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> local_30 [2];
  
  init((EVP_PKEY_CTX *)local_30);
  std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::size
            (local_30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
            );
  local_58 = 0;
  while( true ) {
    sVar2 = std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
            ::size(local_30);
    if (sVar2 <= (ulong)(long)local_58) break;
    std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::
    operator[](local_30,(long)local_58);
    pfVar3 = OpenMesh::VectorT<float,_2>::operator[]
                       ((VectorT<float,_2> *)in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    fVar1 = *pfVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pSVar4 = (double)fVar1;
    std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::
    operator[](local_30,(long)local_58);
    pfVar3 = OpenMesh::VectorT<float,_2>::operator[]
                       ((VectorT<float,_2> *)in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    fVar1 = *pfVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pSVar4 = (double)fVar1;
    local_58 = local_58 + 1;
  }
  getAveLen(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffee0,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  LBFGS(in_stack_000007c8,in_stack_000007c0,in_stack_000007b8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffee0,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d389a);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d38a7);
  local_8c = 0;
  while( true ) {
    sVar2 = std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
            ::size(local_30);
    if (sVar2 <= (ulong)(long)local_8c) break;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    in_stack_fffffffffffffef4 = (float)*pSVar4;
    std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::
    operator[](local_30,(long)local_8c);
    pfVar3 = OpenMesh::VectorT<float,_2>::operator[]
                       ((VectorT<float,_2> *)in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *pfVar3 = in_stack_fffffffffffffef4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffee0,
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    in_stack_fffffffffffffedc = (float)*pSVar4;
    std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::
    operator[](local_30,(long)local_8c);
    in_stack_fffffffffffffee0 =
         (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
         OpenMesh::VectorT<float,_2>::operator[]
                   ((VectorT<float,_2> *)in_stack_fffffffffffffee0,
                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    *(float *)in_stack_fffffffffffffee0 = in_stack_fffffffffffffedc;
    local_8c = local_8c + 1;
  }
  std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::vector
            ((vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *)
             in_stack_fffffffffffffee0,
             (vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d3a11);
  std::vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>::~vector
            ((vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  return in_RDI;
}

Assistant:

std::vector<OpenMesh::Vec2f> bijectiveParameterization(Mesh& mesh, double error) {
    auto init_param = init(mesh); // the initial parameterization for the mesh
    Eigen::VectorXd x(init_param.size() * 2);
    for (int i = 0; i < init_param.size(); ++i) {
        x[2 * i] = init_param[i][0];
        x[2 * i + 1] = init_param[i][1];
    }

    auto epsilon = getAveLen(mesh, x) * 0.25;
    // std::cerr << checkCreterion(mesh, x, epsilon) << std::endl;
    x = LBFGS(mesh, x, 0.0005); // optimize the parameterization using Quasi Newton Method

    // copy the result into a vector
    for (int i = 0; i < init_param.size(); ++i) {
        init_param[i][0] = x[2 * i];
        init_param[i][1] = x[2 * i + 1];
    }

    return std::move(init_param);
}